

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_4::Array2D<Imf_3_4::Array2D<float>_>::resizeErase
          (Array2D<Imf_3_4::Array2D<float>_> *this,long sizeX,long sizeY)

{
  Array2D<float> *pAVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  long lVar7;
  ulong uVar8;
  
  uVar8 = sizeY * sizeX;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  uVar4 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar5 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar5 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar5);
  *puVar6 = uVar8;
  if (uVar8 != 0) {
    memset((Array2D<float> *)(puVar6 + 1),0,((uVar4 - 0x18) - (uVar4 - 0x18) % 0x18) + 0x18);
  }
  pAVar1 = this->_data;
  if (pAVar1 != (Array2D<float> *)0x0) {
    pfVar2 = pAVar1[-1]._data;
    if (pfVar2 != (float *)0x0) {
      lVar7 = (long)pfVar2 * 0x18;
      do {
        Array2D<float>::~Array2D((Array2D<float> *)((long)&pAVar1[-1]._sizeX + lVar7));
        lVar7 = lVar7 + -0x18;
      } while (lVar7 != 0);
    }
    operator_delete__(&pAVar1[-1]._data,(long)pfVar2 * 0x18 + 8);
  }
  this->_sizeX = sizeX;
  this->_sizeY = sizeY;
  this->_data = (Array2D<float> *)(puVar6 + 1);
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}